

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

int goodform::json::convert_hex_to_dec(char input)

{
  if ((byte)(input - 0x30U) < 10) {
    return (uint)(byte)(input - 0x30U);
  }
  if ((byte)((input & 0xdfU) + 0xbf) < 5) {
    return (int)(byte)((input & 0xdfU) - 0x37);
  }
  return -(uint)((input & 0xdfU) != 0x46) | 0xf;
}

Assistant:

int json::convert_hex_to_dec(char input)
  {
    int iReturnValue = -1;
    if(input == '0')
      iReturnValue = 0;
    else if(input == '1')
      iReturnValue = 1;
    else if(input == '2')
      iReturnValue = 2;
    else if(input == '3')
      iReturnValue = 3;
    else if(input == '4')
      iReturnValue = 4;
    else if(input == '5')
      iReturnValue = 5;
    else if(input == '6')
      iReturnValue = 6;
    else if(input == '7')
      iReturnValue = 7;
    else if(input == '8')
      iReturnValue = 8;
    else if(input == '9')
      iReturnValue = 9;
    else if(input == 'a' || input == 'A')
      iReturnValue = 10;
    else if(input == 'b' || input == 'B')
      iReturnValue = 11;
    else if(input == 'c' || input == 'C')
      iReturnValue = 12;
    else if(input == 'd' || input == 'D')
      iReturnValue = 13;
    else if(input == 'e' || input == 'E')
      iReturnValue = 14;
    else if(input == 'f' || input == 'F')
      iReturnValue = 15;
    return iReturnValue;
  }